

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<float>::ExtractSubrange
          (RepeatedField<float> *this,int start,int num,float *elements)

{
  int iVar1;
  LogMessage *pLVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  LogFinisher local_75;
  int local_74;
  ulong local_70;
  LogMessage local_68;
  
  uVar6 = (ulong)(uint)num;
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2d9);
    pLVar2 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(&local_75,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (num < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2da);
    pLVar2 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_75,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
  }
  local_74 = num + start;
  if (this->current_size_ < local_74) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2db);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (start + num) <= (this->current_size_): ");
    internal::LogFinisher::operator=(&local_75,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
  }
  local_70 = uVar6;
  if (0 < num && elements != (float *)0x0) {
    uVar7 = 0;
    do {
      pfVar3 = Get(this,(int)uVar7 + start);
      elements[uVar7] = *pfVar3;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  iVar5 = (int)local_70;
  if (0 < iVar5) {
    iVar1 = this->current_size_;
    if (local_74 < iVar1) {
      do {
        pfVar3 = Get(this,iVar5 + start);
        Set(this,start,pfVar3);
        iVar1 = this->current_size_;
        iVar4 = iVar5 + start;
        start = start + 1;
      } while (iVar4 + 1 < iVar1);
    }
    if (0 < iVar1) {
      this->current_size_ = iVar1 - iVar5;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != nullptr) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}